

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsimd.c
# Opt level: O0

void jsimd_ycc_rgb_convert
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
               JSAMPARRAY output_buf,int num_rows)

{
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  _func_void_JDIMENSION_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *sse2fct;
  _func_void_JDIMENSION_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *avx2fct;
  code *local_38;
  code *local_30;
  
  switch(*(undefined4 *)(in_RDI + 0x40)) {
  case 6:
    local_30 = jsimd_ycc_extrgb_convert_avx2;
    local_38 = jsimd_ycc_extrgb_convert_sse2;
    break;
  case 7:
  case 0xc:
    local_30 = jsimd_ycc_extrgbx_convert_avx2;
    local_38 = jsimd_ycc_extrgbx_convert_sse2;
    break;
  case 8:
    local_30 = jsimd_ycc_extbgr_convert_avx2;
    local_38 = jsimd_ycc_extbgr_convert_sse2;
    break;
  case 9:
  case 0xd:
    local_30 = jsimd_ycc_extbgrx_convert_avx2;
    local_38 = jsimd_ycc_extbgrx_convert_sse2;
    break;
  case 10:
  case 0xe:
    local_30 = jsimd_ycc_extxbgr_convert_avx2;
    local_38 = jsimd_ycc_extxbgr_convert_sse2;
    break;
  case 0xb:
  case 0xf:
    local_30 = jsimd_ycc_extxrgb_convert_avx2;
    local_38 = jsimd_ycc_extxrgb_convert_sse2;
    break;
  default:
    local_30 = jsimd_ycc_rgb_convert_avx2;
    local_38 = jsimd_ycc_rgb_convert_sse2;
  }
  if ((simd_support & 0x80) == 0) {
    (*local_38)(*(undefined4 *)(in_RDI + 0x88),in_RSI,in_EDX,in_RCX,in_R8D);
  }
  else {
    (*local_30)(*(undefined4 *)(in_RDI + 0x88),in_RSI,in_EDX,in_RCX,in_R8D);
  }
  return;
}

Assistant:

GLOBAL(void)
jsimd_ycc_rgb_convert(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                      JDIMENSION input_row, JSAMPARRAY output_buf,
                      int num_rows)
{
  void (*avx2fct) (JDIMENSION, JSAMPIMAGE, JDIMENSION, JSAMPARRAY, int);
  void (*sse2fct) (JDIMENSION, JSAMPIMAGE, JDIMENSION, JSAMPARRAY, int);

  switch (cinfo->out_color_space) {
  case JCS_EXT_RGB:
    avx2fct = jsimd_ycc_extrgb_convert_avx2;
    sse2fct = jsimd_ycc_extrgb_convert_sse2;
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    avx2fct = jsimd_ycc_extrgbx_convert_avx2;
    sse2fct = jsimd_ycc_extrgbx_convert_sse2;
    break;
  case JCS_EXT_BGR:
    avx2fct = jsimd_ycc_extbgr_convert_avx2;
    sse2fct = jsimd_ycc_extbgr_convert_sse2;
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    avx2fct = jsimd_ycc_extbgrx_convert_avx2;
    sse2fct = jsimd_ycc_extbgrx_convert_sse2;
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    avx2fct = jsimd_ycc_extxbgr_convert_avx2;
    sse2fct = jsimd_ycc_extxbgr_convert_sse2;
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    avx2fct = jsimd_ycc_extxrgb_convert_avx2;
    sse2fct = jsimd_ycc_extxrgb_convert_sse2;
    break;
  default:
    avx2fct = jsimd_ycc_rgb_convert_avx2;
    sse2fct = jsimd_ycc_rgb_convert_sse2;
    break;
  }

  if (simd_support & JSIMD_AVX2)
    avx2fct(cinfo->output_width, input_buf, input_row, output_buf, num_rows);
  else
    sse2fct(cinfo->output_width, input_buf, input_row, output_buf, num_rows);
}